

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void pageReinit(DbPage *pData)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  u32 uVar4;
  uint uVar5;
  MemPage *pPage;
  BtShared *pBVar6;
  u8 *puVar7;
  u16 uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  undefined8 uVar12;
  ushort uVar13;
  ushort uVar14;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  bool bVar18;
  
  pPage = (MemPage *)pData->pExtra;
  if ((pPage->isInit == '\0') || (pPage->isInit = '\0', pData->nRef < 2)) {
    return;
  }
  if (pPage->isInit != '\0') {
    return;
  }
  pBVar6 = pPage->pBt;
  puVar7 = pPage->aData;
  bVar1 = pPage->hdrOffset;
  iVar9 = decodeFlags(pPage,(uint)puVar7[bVar1]);
  if (iVar9 != 0) {
    uVar12 = 0xeccd;
    goto LAB_00126314;
  }
  uVar4 = pBVar6->pageSize;
  pPage->maskPage = (short)uVar4 - 1;
  pPage->nOverflow = '\0';
  uVar5 = pBVar6->usableSize;
  bVar2 = pPage->childPtrSize;
  uVar10 = bVar1 + 8 + (uint)bVar2;
  pPage->cellOffset = (u16)uVar10;
  pPage->aDataEnd = puVar7 + (int)uVar5;
  pPage->aCellIdx = puVar7 + (ulong)((uint)bVar1 + (uint)bVar2) + 8;
  pPage->aDataOfst = puVar7 + bVar2;
  bVar2 = puVar7[(ulong)bVar1 + 5];
  uVar13 = *(ushort *)(puVar7 + (ulong)bVar1 + 3) << 8 | *(ushort *)(puVar7 + (ulong)bVar1 + 3) >> 8
  ;
  bVar3 = puVar7[(ulong)bVar1 + 6];
  pPage->nCell = uVar13;
  if ((uVar4 - 8) / 6 < (uint)uVar13) {
    uVar12 = 0xecdf;
    goto LAB_00126314;
  }
  uVar11 = uVar10 + (uint)uVar13 * 2;
  iVar9 = uVar5 - 4;
  if ((pBVar6->db->flags & 0x20000000) != 0) {
    if (pPage->leaf == '\0') {
      iVar9 = uVar5 - 5;
    }
    bVar18 = pPage->nCell != 0;
    if (bVar18) {
      uVar17 = 0;
      do {
        uVar13 = *(ushort *)(puVar7 + uVar17 * 2 + (ulong)uVar10) << 8 |
                 *(ushort *)(puVar7 + uVar17 * 2 + (ulong)uVar10) >> 8;
        if ((uVar13 < uVar11) || (iVar9 < (int)(uint)uVar13)) {
          uVar12 = 0xecfb;
LAB_0012620f:
          sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar12,
                      "ada05cfa86ad7f5645450ac7a2a21c9aa6e57d2c");
          goto LAB_00126219;
        }
        uVar8 = (*pPage->xCellSize)(pPage,puVar7 + (uint)uVar13);
        if ((int)uVar5 < (int)((uint)uVar8 + (uint)uVar13)) {
          uVar12 = 0xed00;
          goto LAB_0012620f;
        }
        uVar17 = uVar17 + 1;
        bVar18 = uVar17 < pPage->nCell;
      } while (bVar18);
    }
    iVar9 = iVar9 + (uint)(pPage->leaf == '\0');
LAB_00126219:
    if (bVar18) {
      return;
    }
  }
  uVar13 = *(ushort *)(puVar7 + (ulong)bVar1 + 1) << 8 | *(ushort *)(puVar7 + (ulong)bVar1 + 1) >> 8
  ;
  iVar16 = (uint)puVar7[(ulong)bVar1 + 7] + (((uint)bVar2 * 0x100 + (uint)bVar3) - 1 & 0xffff) + 1;
  if (uVar13 != 0) {
    uVar12 = 0xed12;
    uVar10 = (uint)uVar13;
    if (uVar13 < uVar11) {
LAB_001262bd:
      bVar18 = false;
      sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar12,
                  "ada05cfa86ad7f5645450ac7a2a21c9aa6e57d2c");
    }
    else {
      do {
        uVar15 = uVar10;
        if (iVar9 < (int)uVar15) {
          uVar12 = 0xed16;
          goto LAB_001262bd;
        }
        uVar14 = *(ushort *)(puVar7 + uVar15) << 8 | *(ushort *)(puVar7 + uVar15) >> 8;
        uVar13 = *(ushort *)(puVar7 + (ulong)uVar15 + 2) << 8 |
                 *(ushort *)(puVar7 + (ulong)uVar15 + 2) >> 8;
        iVar16 = iVar16 + (uint)uVar13;
        uVar10 = (uint)uVar14;
      } while (uVar13 + uVar15 + 3 < (uint)uVar14);
      uVar12 = 0xed1f;
      if (uVar14 != 0) goto LAB_001262bd;
      bVar18 = true;
      uVar12 = 0xed22;
      if (uVar5 < uVar13 + uVar15) goto LAB_001262bd;
    }
    if (!bVar18) {
      return;
    }
  }
  if (iVar16 <= (int)uVar5) {
    pPage->nFree = (short)iVar16 - (short)uVar11;
    pPage->isInit = '\x01';
    return;
  }
  uVar12 = 0xed2e;
LAB_00126314:
  sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar12,
              "ada05cfa86ad7f5645450ac7a2a21c9aa6e57d2c");
  return;
}

Assistant:

static void pageReinit(DbPage *pData){
  MemPage *pPage;
  pPage = (MemPage *)sqlite3PagerGetExtra(pData);
  assert( sqlite3PagerPageRefcount(pData)>0 );
  if( pPage->isInit ){
    assert( sqlite3_mutex_held(pPage->pBt->mutex) );
    pPage->isInit = 0;
    if( sqlite3PagerPageRefcount(pData)>1 ){
      /* pPage might not be a btree page;  it might be an overflow page
      ** or ptrmap page or a free page.  In those cases, the following
      ** call to btreeInitPage() will likely return SQLITE_CORRUPT.
      ** But no harm is done by this.  And it is very important that
      ** btreeInitPage() be called on every btree page so we make
      ** the call for every page that comes in for re-initing. */
      btreeInitPage(pPage);
    }
  }
}